

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter.h
# Opt level: O1

void __thiscall Unary::Unary(Unary *this,shared_ptr<Token> *t,shared_ptr<Expr> *x)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  undefined1 auVar3 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  shared_ptr<Type> local_88;
  shared_ptr<Type> local_78;
  shared_ptr<Token> local_68;
  undefined1 local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  string local_48;
  shared_ptr<Type> local_28;
  
  local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (t->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (t->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  local_28.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_28.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Op::Op(&this->super_Op,&local_68,&local_28);
  if (local_28.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  (this->super_Op).super_Expr.super_Node._vptr_Node = (_func_int **)&PTR_toJson_abi_cxx11__0012b010;
  (this->expr).super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (x->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (x->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->expr).super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_78.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       Type::Int.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_78.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       Type::Int.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (Type::Int.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (Type::Int.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (Type::Int.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (Type::Int.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (Type::Int.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  peVar2 = (x->super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_88.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar2->type).super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar2->type).super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_88.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_88.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_88.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_88.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  Type::max((Type *)local_58,&local_78,&local_88);
  p_Var4 = p_Stack_50;
  auVar3 = local_58;
  local_58 = (undefined1  [8])0x0;
  p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->super_Op).super_Expr.type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->super_Op).super_Expr.type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auVar3;
  (this->super_Op).super_Expr.type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var4;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  if (local_88.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_78.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((this->super_Op).super_Expr.type.super___shared_ptr<Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"type error","");
    Node::error((Node *)this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

Unary(std::shared_ptr<Token> t, std::shared_ptr<Expr> x) : Op(t, nullptr), expr(x) {
		type = Type::max(Type::Int, x->type);
		if (type == nullptr) error("type error");
	}